

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printAlignedLabel(MCInst *MI,uint OpNum,SStream *O)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint id;
  MCOperand *op;
  int64_t iVar4;
  uint8_t *puVar5;
  uint8_t uVar6;
  uint64_t val;
  
  op = MCInst_getOperand(MI,OpNum);
  _Var3 = MCOperand_isImm(op);
  if (_Var3) {
    iVar4 = MCOperand_getImm(op);
    val = iVar4 * 4 + MI->address;
    printUInt64Bang(O,val);
    h = MI->csh;
    if (h->detail != CS_OPT_OFF) {
      id = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar5 = AArch64_get_op_access(h,id);
      uVar6 = '\0';
      if (puVar5[bVar1] != 0x80) {
        uVar6 = puVar5[bVar1];
      }
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar5 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar5[0] = '\x02';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(uint64_t *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = val;
      puVar5 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar5 = *puVar5 + '\x01';
    }
  }
  return;
}

Assistant:

static void printAlignedLabel(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);

	// If the label has already been resolved to an immediate offset (say, when
	// we're running the disassembler), just print the immediate.
	if (MCOperand_isImm(Op)) {
		uint64_t imm = (MCOperand_getImm(Op) * 4) + MI->address;
		printUInt64Bang(O, imm);
		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = imm;
			MI->flat_insn->detail->arm64.op_count++;
		}
		return;
	}
}